

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cCommonBugsTests.cpp
# Opt level: O2

string * __thiscall
gl3cts::PerVertexValidationTest::getVertexShaderBody
          (string *__return_storage_ptr__,PerVertexValidationTest *this,ContextType context_type,
          _test_iteration iteration,string *main_body)

{
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  stringstream vs_body_sstream;
  stringstream local_1b8 [16];
  ostream local_1a8;
  
  pcVar7 = glcts::fixed_sample_locations_values + 1;
  pcVar5 = "float gl_ClipDistance[];\n";
  if ((iteration << 0x1e | iteration >> 2) < 6) {
    pcVar5 = glcts::fixed_sample_locations_values + 1;
  }
  if (iteration == TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_VS_GL_CLIPDISTANCE_USAGE) {
    pcVar5 = glcts::fixed_sample_locations_values + 1;
  }
  if (((iteration - TEST_ITERATION_UNDECLARED_IN_PERVERTEX_GS_GL_CULLDISTANCE_USAGE) * 0x40000000 |
      iteration - TEST_ITERATION_UNDECLARED_IN_PERVERTEX_GS_GL_CULLDISTANCE_USAGE >> 2) < 7) {
    bVar1 = false;
  }
  else {
    bVar1 = glu::contextSupports(context_type,(ApiType)0x154);
  }
  pcVar3 = "float gl_PointSize;\n";
  if (((iteration - TEST_ITERATION_UNDECLARED_IN_PERVERTEX_GS_GL_POINTSIZE_USAGE) * 0x40000000 |
      iteration - TEST_ITERATION_UNDECLARED_IN_PERVERTEX_GS_GL_POINTSIZE_USAGE >> 2) < 6) {
    pcVar3 = glcts::fixed_sample_locations_values + 1;
  }
  if (iteration == TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_VS_GL_POINTSIZE_USAGE) {
    pcVar3 = glcts::fixed_sample_locations_values + 1;
  }
  pcVar6 = "vec4  gl_Position;\n";
  if (((iteration - TEST_ITERATION_UNDECLARED_IN_PERVERTEX_GS_GL_POSITION_USAGE) * 0x40000000 |
      iteration - TEST_ITERATION_UNDECLARED_IN_PERVERTEX_GS_GL_POSITION_USAGE >> 2) < 6) {
    pcVar6 = glcts::fixed_sample_locations_values + 1;
  }
  if (iteration == TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_VS_GL_POSITION_USAGE) {
    pcVar6 = glcts::fixed_sample_locations_values + 1;
  }
  std::__cxx11::stringstream::stringstream(local_1b8);
  poVar2 = std::operator<<(&local_1a8,"#version ");
  pcVar4 = "320";
  if (bVar1 != false) {
    pcVar4 = "450";
  }
  poVar2 = std::operator<<(poVar2,pcVar4);
  std::operator<<(poVar2,"\n\nin gl_PerVertex\n{\n");
  std::operator<<(&local_1a8,pcVar5);
  std::operator<<(&local_1a8,pcVar3);
  std::operator<<(&local_1a8,pcVar6);
  if (bVar1 != false) {
    pcVar7 = "float gl_CullDistance[];\n";
  }
  std::operator<<(&local_1a8,pcVar7);
  std::operator<<(&local_1a8,"};\n\nout gl_PerVertex\n{\n");
  std::operator<<(&local_1a8,pcVar5);
  std::operator<<(&local_1a8,pcVar3);
  std::operator<<(&local_1a8,pcVar6);
  std::operator<<(&local_1a8,pcVar7);
  poVar2 = std::operator<<(&local_1a8,"};\n\nvoid main()\n{\n    ");
  poVar2 = std::operator<<(poVar2,(string *)main_body);
  std::operator<<(poVar2,"\n}\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string PerVertexValidationTest::getVertexShaderBody(glu::ContextType context_type, _test_iteration iteration,
														 std::string main_body) const
{
	const bool include_clip_distance = (iteration != TEST_ITERATION_UNDECLARED_IN_PERVERTEX_GS_GL_CLIPDISTANCE_USAGE &&
										iteration != TEST_ITERATION_UNDECLARED_IN_PERVERTEX_TC_GL_CLIPDISTANCE_USAGE &&
										iteration != TEST_ITERATION_UNDECLARED_IN_PERVERTEX_TE_GL_CLIPDISTANCE_USAGE &&
										iteration != TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_GS_GL_CLIPDISTANCE_USAGE &&
										iteration != TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_TC_GL_CLIPDISTANCE_USAGE &&
										iteration != TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_TE_GL_CLIPDISTANCE_USAGE &&
										iteration != TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_VS_GL_CLIPDISTANCE_USAGE);
	const bool include_cull_distance = (iteration != TEST_ITERATION_UNDECLARED_IN_PERVERTEX_GS_GL_CULLDISTANCE_USAGE &&
										iteration != TEST_ITERATION_UNDECLARED_IN_PERVERTEX_TC_GL_CULLDISTANCE_USAGE &&
										iteration != TEST_ITERATION_UNDECLARED_IN_PERVERTEX_TE_GL_CULLDISTANCE_USAGE &&
										iteration != TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_GS_GL_CULLDISTANCE_USAGE &&
										iteration != TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_TC_GL_CULLDISTANCE_USAGE &&
										iteration != TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_TE_GL_CULLDISTANCE_USAGE &&
										iteration != TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_VS_GL_CULLDISTANCE_USAGE &&
										glu::contextSupports(context_type, glu::ApiType::core(4, 5)));
	const bool include_pointsize = (iteration != TEST_ITERATION_UNDECLARED_IN_PERVERTEX_GS_GL_POINTSIZE_USAGE &&
									iteration != TEST_ITERATION_UNDECLARED_IN_PERVERTEX_TC_GL_POINTSIZE_USAGE &&
									iteration != TEST_ITERATION_UNDECLARED_IN_PERVERTEX_TE_GL_POINTSIZE_USAGE &&
									iteration != TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_GS_GL_POINTSIZE_USAGE &&
									iteration != TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_TC_GL_POINTSIZE_USAGE &&
									iteration != TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_TE_GL_POINTSIZE_USAGE &&
									iteration != TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_VS_GL_POINTSIZE_USAGE);
	const bool include_position = (iteration != TEST_ITERATION_UNDECLARED_IN_PERVERTEX_GS_GL_POSITION_USAGE &&
								   iteration != TEST_ITERATION_UNDECLARED_IN_PERVERTEX_TC_GL_POSITION_USAGE &&
								   iteration != TEST_ITERATION_UNDECLARED_IN_PERVERTEX_TE_GL_POSITION_USAGE &&
								   iteration != TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_GS_GL_POSITION_USAGE &&
								   iteration != TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_TC_GL_POSITION_USAGE &&
								   iteration != TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_TE_GL_POSITION_USAGE &&
								   iteration != TEST_ITERATION_UNDECLARED_OUT_PERVERTEX_VS_GL_POSITION_USAGE);
	std::stringstream vs_body_sstream;

	vs_body_sstream << "#version " << ((include_cull_distance) ? "450" : "320") << "\n"
																				   "\n"
																				   "in gl_PerVertex\n"
																				   "{\n";

	vs_body_sstream << ((include_clip_distance) ? "float gl_ClipDistance[];\n" : "");
	vs_body_sstream << ((include_pointsize) ? "float gl_PointSize;\n" : "");
	vs_body_sstream << ((include_position) ? "vec4  gl_Position;\n" : "");
	vs_body_sstream << ((include_cull_distance) ? "float gl_CullDistance[];\n" : "");

	vs_body_sstream << "};\n"
					   "\n"
					   "out gl_PerVertex\n"
					   "{\n";

	vs_body_sstream << ((include_clip_distance) ? "float gl_ClipDistance[];\n" : "");
	vs_body_sstream << ((include_pointsize) ? "float gl_PointSize;\n" : "");
	vs_body_sstream << ((include_position) ? "vec4  gl_Position;\n" : "");
	vs_body_sstream << ((include_cull_distance) ? "float gl_CullDistance[];\n" : "");

	vs_body_sstream << "};\n"
					   "\n"
					   "void main()\n"
					   "{\n"
					   "    "
					<< main_body << "\n"
									"}\n";

	return vs_body_sstream.str();
}